

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase847::run(TestCase847 *this)

{
  PromiseFulfiller<void> *pPVar1;
  SourceLocation location;
  SourceLocation location_00;
  SourceLocation location_01;
  SourceLocation location_02;
  SourceLocation location_03;
  bool bVar2;
  char *params;
  uint *tasksCompleted_00;
  DebugExpression<bool> _kjCondition_9;
  uint tasksCompleted;
  Promise<void> promise;
  WaitScope waitScope;
  Pafs pafs;
  Array<char> local_580;
  DebugComparison<unsigned_int_&,_int> _kjCondition;
  undefined8 local_538;
  undefined8 local_530;
  DebugExpression<bool> _kjCondition_1;
  undefined7 uStack_3cf;
  EventLoop loop;
  StringPtr local_1c0 [25];
  
  EventLoop::EventLoop(&loop);
  waitScope.busyPollInterval = 0xffffffff;
  waitScope.fiber.ptr = (FiberBase *)0x0;
  waitScope.runningStacksPool.ptr = (FiberPool *)0x0;
  waitScope.loop = &loop;
  EventLoop::enterScope(&loop);
  tasksCompleted = 0;
  makeCompletionCountingPafs(&pafs,(uint)&tasksCompleted,tasksCompleted_00);
  location.function = "run";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  location.lineNumber = 0x356;
  location.columnNumber = 0x1b;
  joinPromises((Array<kj::Promise<void>_> *)&promise,location);
  _kjCondition._8_8_ = (ulong)(uint)_kjCondition._12_4_ << 0x20;
  _kjCondition.result = tasksCompleted == 0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.left = &tasksCompleted;
  if ((!_kjCondition.result) && ((int)kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[37],kj::_::DebugComparison<unsigned_int&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x35a,ERROR,"\"failed: expected \" \"tasksCompleted == 0\", _kjCondition",
               (char (*) [37])"failed: expected tasksCompleted == 0",&_kjCondition);
  }
  (*((pafs.fulfillers.ptr)->ptr->super_PromiseRejector)._vptr_PromiseRejector[2])
            ((pafs.fulfillers.ptr)->ptr,&_kjCondition);
  _kjCondition.left = (uint *)anon_var_dwarf_4f636;
  _kjCondition._8_8_ = (long)"this branch shouldn\'t run" + 0x16;
  _kjCondition.op.content.ptr = (char *)0x270000035e;
  location_00.function = "run";
  location_00.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  location_00.lineNumber = 0x35e;
  location_00.columnNumber = 0x27;
  bVar2 = kj::_::pollImpl((PromiseNode *)promise.super_PromiseBase.node.ptr,&waitScope,location_00);
  __kjCondition_1 = (char *)CONCAT71(uStack_3cf,!bVar2);
  if (bVar2 && (int)kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[42],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x35e,ERROR,"\"failed: expected \" \"!promise.poll(waitScope)\", _kjCondition",
               (char (*) [42])"failed: expected !promise.poll(waitScope)",&_kjCondition_1);
  }
  _kjCondition._8_8_ = _kjCondition._8_8_ & 0xffffffff00000000;
  _kjCondition.result = tasksCompleted == 0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.left = &tasksCompleted;
  if ((!_kjCondition.result) && ((int)kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[37],kj::_::DebugComparison<unsigned_int&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x35f,ERROR,"\"failed: expected \" \"tasksCompleted == 0\", _kjCondition",
               (char (*) [37])"failed: expected tasksCompleted == 0",&_kjCondition);
  }
  (*((pafs.fulfillers.ptr[1].ptr)->super_PromiseRejector)._vptr_PromiseRejector[2])
            (pafs.fulfillers.ptr[1].ptr,&_kjCondition);
  _kjCondition.left = (uint *)anon_var_dwarf_4f636;
  _kjCondition._8_8_ = (long)"this branch shouldn\'t run" + 0x16;
  _kjCondition.op.content.ptr = (char *)0x2700000362;
  location_01.function = "run";
  location_01.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  location_01.lineNumber = 0x362;
  location_01.columnNumber = 0x27;
  bVar2 = kj::_::pollImpl((PromiseNode *)promise.super_PromiseBase.node.ptr,&waitScope,location_01);
  __kjCondition_1 = (char *)CONCAT71(uStack_3cf,!bVar2);
  if (bVar2 && (int)kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[42],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x362,ERROR,"\"failed: expected \" \"!promise.poll(waitScope)\", _kjCondition",
               (char (*) [42])"failed: expected !promise.poll(waitScope)",&_kjCondition_1);
  }
  params = (char *)(ulong)kj::_::Debug::minSeverity;
  _kjCondition._8_8_ = _kjCondition._8_8_ & 0xffffffff00000000;
  _kjCondition.result = tasksCompleted == 0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.left = &tasksCompleted;
  if ((!_kjCondition.result) && ((int)kj::_::Debug::minSeverity < 3)) {
    params = "\"failed: expected \" \"tasksCompleted == 0\", _kjCondition";
    kj::_::Debug::log<char_const(&)[37],kj::_::DebugComparison<unsigned_int&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x363,ERROR,"\"failed: expected \" \"tasksCompleted == 0\", _kjCondition",
               (char (*) [37])"failed: expected tasksCompleted == 0",&_kjCondition);
  }
  pPVar1 = pafs.fulfillers.ptr[2].ptr;
  kj::_::Debug::makeDescription<char_const(&)[15]>
            ((String *)&local_580,(Debug *)"\"Test exception\"","Test exception",
             (char (*) [15])params);
  Exception::Exception
            ((Exception *)&_kjCondition,FAILED,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
             ,0x366,(String *)&local_580);
  (**(pPVar1->super_PromiseRejector)._vptr_PromiseRejector)(pPVar1,(Exception *)&_kjCondition);
  Exception::~Exception((Exception *)&_kjCondition);
  Array<char>::~Array(&local_580);
  _kjCondition.left = (uint *)anon_var_dwarf_4f636;
  _kjCondition._8_8_ = (long)"this branch shouldn\'t run" + 0x16;
  _kjCondition.op.content.ptr = (char *)0x2700000367;
  location_02.function = "run";
  location_02.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  location_02.lineNumber = 0x367;
  location_02.columnNumber = 0x27;
  bVar2 = kj::_::pollImpl((PromiseNode *)promise.super_PromiseBase.node.ptr,&waitScope,location_02);
  __kjCondition_1 = (char *)CONCAT71(uStack_3cf,!bVar2);
  if (bVar2 && (int)kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[42],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x367,ERROR,"\"failed: expected \" \"!promise.poll(waitScope)\", _kjCondition",
               (char (*) [42])"failed: expected !promise.poll(waitScope)",&_kjCondition_1);
  }
  _kjCondition._8_8_ = _kjCondition._8_8_ & 0xffffffff00000000;
  _kjCondition.result = tasksCompleted == 0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.left = &tasksCompleted;
  if ((!_kjCondition.result) && ((int)kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[37],kj::_::DebugComparison<unsigned_int&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x368,ERROR,"\"failed: expected \" \"tasksCompleted == 0\", _kjCondition",
               (char (*) [37])"failed: expected tasksCompleted == 0",&_kjCondition);
  }
  (*((pafs.fulfillers.ptr[3].ptr)->super_PromiseRejector)._vptr_PromiseRejector[2])
            (pafs.fulfillers.ptr[3].ptr,&_kjCondition);
  _kjCondition.left = (uint *)anon_var_dwarf_4f636;
  _kjCondition._8_8_ = (long)"this branch shouldn\'t run" + 0x16;
  _kjCondition.op.content.ptr = (char *)0x270000036b;
  location_03.function = "run";
  location_03.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  location_03.lineNumber = 0x36b;
  location_03.columnNumber = 0x27;
  bVar2 = kj::_::pollImpl((PromiseNode *)promise.super_PromiseBase.node.ptr,&waitScope,location_03);
  __kjCondition_1 = (char *)CONCAT71(uStack_3cf,!bVar2);
  if (bVar2 && (int)kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[42],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x36b,ERROR,"\"failed: expected \" \"!promise.poll(waitScope)\", _kjCondition",
               (char (*) [42])"failed: expected !promise.poll(waitScope)",&_kjCondition_1);
  }
  _kjCondition._8_8_ = _kjCondition._8_8_ & 0xffffffff00000000;
  _kjCondition.result = tasksCompleted == 0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.left = &tasksCompleted;
  if ((!_kjCondition.result) && ((int)kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[37],kj::_::DebugComparison<unsigned_int&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x36c,ERROR,"\"failed: expected \" \"tasksCompleted == 0\", _kjCondition",
               (char (*) [37])"failed: expected tasksCompleted == 0",&_kjCondition);
  }
  (*((pafs.fulfillers.ptr[4].ptr)->super_PromiseRejector)._vptr_PromiseRejector[2])
            (pafs.fulfillers.ptr[4].ptr,&_kjCondition);
  Promise<void>::wait(&promise,&waitScope);
  __kjCondition_1 = (char *)((ulong)__kjCondition_1 & 0xffffffffffffff00);
  kj::_::NullableValue<kj::Exception>::NullableValue
            ((NullableValue<kj::Exception> *)&_kjCondition,
             (NullableValue<kj::Exception> *)&_kjCondition_1);
  kj::_::NullableValue<kj::Exception>::~NullableValue
            ((NullableValue<kj::Exception> *)&_kjCondition_1);
  if ((char)_kjCondition.left == '\x01') {
    if ((ArrayDisposer *)local_530 == (ArrayDisposer *)0x0) {
      local_538 = "";
    }
    local_1c0[0].content.ptr = "Test exception";
    local_1c0[0].content.size_ = 0xf;
    __kjCondition_1 = (char *)local_538;
    _kjCondition_9.value = StringPtr::contains((StringPtr *)&_kjCondition_1,local_1c0);
    if ((int)kj::_::Debug::minSeverity < 3 && !_kjCondition_9.value) {
      kj::_::Debug::
      log<char_const(&)[63],kj::_::DebugExpression<bool>&,char_const(&)[56],kj::Exception&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x370,ERROR,
                 "\"failed: expected \" \"e.getDescription().contains(\\\"Test exception\\\")\", _kjCondition, \"exception description didn\'t contain expected substring\", e"
                 ,(char (*) [63])"failed: expected e.getDescription().contains(\"Test exception\")",
                 &_kjCondition_9,
                 (char (*) [56])"exception description didn\'t contain expected substring",
                 (Exception *)&_kjCondition.right);
    }
  }
  else if ((int)kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[44]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x370,ERROR,"\"code did not throw: \" \"promise.wait(waitScope)\"",
               (char (*) [44])"code did not throw: promise.wait(waitScope)");
  }
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&_kjCondition)
  ;
  _kjCondition.result = tasksCompleted == 4;
  _kjCondition.right = 4;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.left = &tasksCompleted;
  if ((!_kjCondition.result) && ((int)kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[37],kj::_::DebugComparison<unsigned_int&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x371,ERROR,"\"failed: expected \" \"tasksCompleted == 4\", _kjCondition",
               (char (*) [37])"failed: expected tasksCompleted == 4",&_kjCondition);
  }
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&promise);
  Pafs::~Pafs(&pafs);
  WaitScope::~WaitScope(&waitScope);
  EventLoop::~EventLoop(&loop);
  return;
}

Assistant:

TEST(Async, ArrayJoinException) {
  EventLoop loop;
  WaitScope waitScope(loop);

  uint tasksCompleted = 0;
  auto pafs = makeCompletionCountingPafs(5, tasksCompleted);
  auto& fulfillers = pafs.fulfillers;
  Promise<void> promise = joinPromises(kj::mv(pafs.promises));

  {
    uint i = 0;
    KJ_EXPECT(tasksCompleted == 0);

    // Joined tasks are not completed early.
    fulfillers[i++]->fulfill();
    KJ_EXPECT(!promise.poll(waitScope));
    KJ_EXPECT(tasksCompleted == 0);

    fulfillers[i++]->fulfill();
    KJ_EXPECT(!promise.poll(waitScope));
    KJ_EXPECT(tasksCompleted == 0);

    // Rejected tasks do not fail-fast.
    fulfillers[i++]->reject(KJ_EXCEPTION(FAILED, "Test exception"));
    KJ_EXPECT(!promise.poll(waitScope));
    KJ_EXPECT(tasksCompleted == 0);

    fulfillers[i++]->fulfill();
    KJ_EXPECT(!promise.poll(waitScope));
    KJ_EXPECT(tasksCompleted == 0);

    // The final fulfillment makes the promise ready.
    fulfillers[i++]->fulfill();
    KJ_EXPECT_THROW_RECOVERABLE_MESSAGE("Test exception", promise.wait(waitScope));
    KJ_EXPECT(tasksCompleted == 4);
  }
}